

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

vw * setup(options_i *options)

{
  _func_int *p_Var1;
  char cVar2;
  bool bVar3;
  int iVar4;
  vw *pvVar5;
  byte bVar6;
  vw_ostream *pvVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pvVar5 = VW::initialize(options,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  pvVar5->vw_is_main = true;
  if (((pvVar5->quiet == false) && (pvVar5->bfgs == false)) && (pvVar5->searchstr == (void *)0x0)) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"audit_regressor","");
    iVar4 = (*options->_vptr_options_i[1])(options,local_50);
    bVar6 = (byte)iVar4 ^ 1;
    bVar3 = true;
  }
  else {
    bVar3 = false;
    bVar6 = 0;
  }
  if ((bVar3) && (local_50[0] != local_40)) {
    operator_delete(local_50[0]);
  }
  if (bVar6 != 0) {
    pvVar7 = &pvVar5->trace_message;
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"average",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"since",5);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x80;
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"example",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"example",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"current",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"current",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"current",7);
    cVar2 = (char)pvVar7;
    std::ios::widen((char)(pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"loss",4);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"last",4);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    p_Var1 = (pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var1 + 0x18 + (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x80;
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"counter",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 0xe;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"weight",6);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"label",5);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"predict",7);
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream," ",1);
    *(undefined8 *)
     ((pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar5->trace_message).super_ostream._vptr_basic_ostream) = 8;
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar7->super_ostream,"features",8);
    std::ios::widen((char)(pvVar5->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  return pvVar5;
}

Assistant:

vw* setup(options_i& options)
{
  vw* all = nullptr;
  try
  {
    all = VW::initialize(options);
  }
  catch (const exception& ex)
  {
    cout << ex.what() << endl;
    throw;
  }
  catch (...)
  {
    cout << "unknown exception" << endl;
    throw;
  }
  all->vw_is_main = true;

  if (!all->quiet && !all->bfgs && !all->searchstr && !options.was_supplied("audit_regressor"))
  {
    all->trace_message << std::left << std::setw(shared_data::col_avg_loss) << std::left << "average"
                       << " " << std::setw(shared_data::col_since_last) << std::left << "since"
                       << " " << std::right << std::setw(shared_data::col_example_counter) << "example"
                       << " " << std::setw(shared_data::col_example_weight) << "example"
                       << " " << std::setw(shared_data::col_current_label) << "current"
                       << " " << std::setw(shared_data::col_current_predict) << "current"
                       << " " << std::setw(shared_data::col_current_features) << "current" << std::endl;
    all->trace_message << std::left << std::setw(shared_data::col_avg_loss) << std::left << "loss"
                       << " " << std::setw(shared_data::col_since_last) << std::left << "last"
                       << " " << std::right << std::setw(shared_data::col_example_counter) << "counter"
                       << " " << std::setw(shared_data::col_example_weight) << "weight"
                       << " " << std::setw(shared_data::col_current_label) << "label"
                       << " " << std::setw(shared_data::col_current_predict) << "predict"
                       << " " << std::setw(shared_data::col_current_features) << "features" << std::endl;
  }

  return all;
}